

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O3

void __thiscall OpenMD::IndexFinder::IndexFinder(IndexFinder *this,SimInfo *info)

{
  vector<int,_std::allocator<int>_> *this_00;
  SimInfo *pSVar1;
  int *piVar2;
  iterator iVar3;
  EVP_PKEY_CTX *ctx;
  int local_24;
  
  this->info_ = info;
  this_00 = &this->nObjects_;
  (this->selectionSets_).
  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->selectionSets_).
  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->selectionSets_).
  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,(iterator)0x0,&local_24);
  pSVar1 = this->info_;
  iVar3._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,&local_24);
    pSVar1 = this->info_;
    iVar3._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = pSVar1->nGlobalBonds_;
    iVar3._M_current = iVar3._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,&local_24);
    pSVar1 = this->info_;
    iVar3._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = pSVar1->nGlobalBends_;
    iVar3._M_current = iVar3._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,&local_24);
    pSVar1 = this->info_;
    iVar3._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = pSVar1->nGlobalTorsions_;
    iVar3._M_current = iVar3._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,&local_24);
    pSVar1 = this->info_;
    iVar3._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = pSVar1->nGlobalInversions_;
    iVar3._M_current = iVar3._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,&local_24);
    pSVar1 = this->info_;
  }
  else {
    *iVar3._M_current = pSVar1->nGlobalMols_;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  ctx = (EVP_PKEY_CTX *)(long)pSVar1->nGlobalMols_;
  std::vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::resize
            (&this->selectionSets_,(size_type)ctx);
  init(this,ctx);
  return;
}

Assistant:

IndexFinder::IndexFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    selectionSets_.resize(info_->getNGlobalMolecules());
    init();
  }